

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_uncompressed.cpp
# Opt level: O2

void duckdb::StandardFixedSizeAppend::Append<int>
               (SegmentStatistics *stats,data_ptr_t target,idx_t target_offset,
               UnifiedVectorFormat *adata,idx_t offset,idx_t count)

{
  int iVar1;
  data_ptr_t pdVar2;
  sel_t *psVar3;
  SelectionVector *pSVar4;
  int iVar5;
  int iVar6;
  undefined4 uVar7;
  ulong uVar8;
  idx_t row_idx;
  data_ptr_t pdVar9;
  bool bVar10;
  
  pdVar2 = adata->data;
  if ((adata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    pdVar9 = target + target_offset * 4;
    pSVar4 = adata->sel;
    while (bVar10 = count != 0, count = count - 1, bVar10) {
      psVar3 = pSVar4->sel_vector;
      uVar8 = offset;
      if (psVar3 != (sel_t *)0x0) {
        uVar8 = (ulong)psVar3[offset];
      }
      iVar5 = *(int *)(pdVar2 + uVar8 * 4);
      iVar6 = *(int *)((long)&(stats->statistics).stats_union + 8);
      iVar1 = *(int *)((long)&(stats->statistics).stats_union + 0x18);
      if (iVar5 <= iVar6) {
        iVar6 = iVar5;
      }
      *(int *)((long)&(stats->statistics).stats_union + 8) = iVar6;
      if (iVar5 < iVar1) {
        iVar5 = iVar1;
      }
      *(int *)((long)&(stats->statistics).stats_union + 0x18) = iVar5;
      *(undefined4 *)pdVar9 = *(undefined4 *)(pdVar2 + uVar8 * 4);
      pdVar9 = pdVar9 + 4;
      offset = offset + 1;
    }
  }
  else {
    pdVar9 = target + target_offset * 4;
    while (bVar10 = count != 0, count = count - 1, bVar10) {
      psVar3 = adata->sel->sel_vector;
      row_idx = offset;
      if (psVar3 != (sel_t *)0x0) {
        row_idx = (idx_t)psVar3[offset];
      }
      bVar10 = TemplatedValidityMask<unsigned_long>::RowIsValid
                         (&(adata->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
      uVar7 = 0x80000000;
      if (bVar10) {
        iVar5 = *(int *)(pdVar2 + row_idx * 4);
        iVar6 = *(int *)((long)&(stats->statistics).stats_union + 8);
        iVar1 = *(int *)((long)&(stats->statistics).stats_union + 0x18);
        if (iVar5 <= iVar6) {
          iVar6 = iVar5;
        }
        *(int *)((long)&(stats->statistics).stats_union + 8) = iVar6;
        if (iVar5 < iVar1) {
          iVar5 = iVar1;
        }
        *(int *)((long)&(stats->statistics).stats_union + 0x18) = iVar5;
        uVar7 = *(undefined4 *)(pdVar2 + row_idx * 4);
      }
      *(undefined4 *)pdVar9 = uVar7;
      pdVar9 = pdVar9 + 4;
      offset = offset + 1;
    }
  }
  return;
}

Assistant:

static void Append(SegmentStatistics &stats, data_ptr_t target, idx_t target_offset, UnifiedVectorFormat &adata,
	                   idx_t offset, idx_t count) {
		auto sdata = UnifiedVectorFormat::GetData<T>(adata);
		auto tdata = reinterpret_cast<T *>(target);
		if (!adata.validity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto source_idx = adata.sel->get_index(offset + i);
				auto target_idx = target_offset + i;
				bool is_null = !adata.validity.RowIsValid(source_idx);
				if (!is_null) {
					stats.statistics.UpdateNumericStats<T>(sdata[source_idx]);
					tdata[target_idx] = sdata[source_idx];
				} else {
					// we insert a NullValue<T> in the null gap for debuggability
					// this value should never be used or read anywhere
					tdata[target_idx] = NullValue<T>();
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto source_idx = adata.sel->get_index(offset + i);
				auto target_idx = target_offset + i;
				stats.statistics.UpdateNumericStats<T>(sdata[source_idx]);
				tdata[target_idx] = sdata[source_idx];
			}
		}
	}